

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentPtr::SetStates(ON_SubDComponentPtr *this,ON_ComponentStatus states_to_set)

{
  Type TVar1;
  uint uVar2;
  ON_SubDVertex *pOVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDFace *pOVar5;
  ON_SubDFace *face;
  ON_SubDEdge *edge;
  ON_SubDVertex *vertex;
  ON_SubDComponentPtr *this_local;
  ON_ComponentStatus states_to_set_local;
  
  TVar1 = ComponentType(this);
  switch(TVar1) {
  case Unset:
    break;
  case Vertex:
    pOVar3 = Vertex(this);
    if (pOVar3 != (ON_SubDVertex *)0x0) {
      uVar2 = ON_ComponentStatus::SetStates
                        (&(pOVar3->super_ON_SubDComponentBase).m_status,states_to_set);
      return uVar2;
    }
    break;
  case Edge:
    pOVar4 = Edge(this);
    if (pOVar4 != (ON_SubDEdge *)0x0) {
      uVar2 = ON_ComponentStatus::SetStates
                        (&(pOVar4->super_ON_SubDComponentBase).m_status,states_to_set);
      return uVar2;
    }
    break;
  case Face:
    pOVar5 = Face(this);
    if (pOVar5 != (ON_SubDFace *)0x0) {
      uVar2 = ON_ComponentStatus::SetStates
                        (&(pOVar5->super_ON_SubDComponentBase).m_status,states_to_set);
      return uVar2;
    }
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDComponentPtr::SetStates(
  ON_ComponentStatus states_to_set
  )
{
  switch (ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = Vertex();
      if (nullptr != vertex)
        return vertex->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = Edge();
      if (nullptr != edge)
        return edge->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = Face();
      if (nullptr != face)
        return face->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Unset:
    break;
  }
  return ON_SUBD_RETURN_ERROR(0);
}